

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O2

int Abc_CommandGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Pla_Man_t *pPVar5;
  char *pcVar6;
  uint fVerbose;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  uVar4 = 0;
  Extra_UtilGetoptReset();
  local_44 = 0x14;
  local_48 = 1;
  local_4c = 8;
  bVar9 = false;
  bVar1 = false;
  fVerbose = 0;
LAB_00360a45:
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"IOPSspvh"), iVar7 = globalUtilOptind, iVar2 == 0x76
            ) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        if (bVar9) {
          Pla_GenSorter(local_4c);
          pPVar5 = (Pla_Man_t *)0x0;
        }
        else if (bVar1) {
          pPVar5 = Pla_ManPrimesDetector(local_4c);
        }
        else {
          iVar7 = 1;
          while( true ) {
            Gia_ManRandom(iVar7);
            bVar9 = uVar4 == 0;
            uVar4 = uVar4 - 1;
            if (bVar9) break;
            iVar7 = 0;
          }
          pPVar5 = Pla_ManGenerate(local_4c,local_48,local_44,fVerbose);
        }
        Pla_AbcFreeMan(pAbc);
        pAbc->pAbcPla = pPVar5;
        return 0;
      }
      if (iVar2 != 0x73) break;
      bVar9 = (bool)(bVar9 ^ 1);
    }
    if (iVar2 == 0x4f) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-O\" should be followed by an integer.\n";
LAB_00360be6:
        Abc_Print(-1,pcVar6);
        goto LAB_00360bf0;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_48 = uVar3;
    }
    else if (iVar2 == 0x50) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_00360be6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_44 = uVar3;
    }
    else if (iVar2 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00360be6;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      uVar3 = uVar4;
    }
    else {
      if (iVar2 == 0x70) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_00360a45;
      }
      if (iVar2 != 0x49) goto LAB_00360bf0;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_00360be6;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_4c = uVar3;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar3 < 0) {
LAB_00360bf0:
      Abc_Print(-2,"usage: |gen [-IOPS num] [-spvh]\n");
      Abc_Print(-2,"\t         generate random or specialized SOP\n");
      Abc_Print(-2,"\t-I num : the number of inputs [default = %d]\n",(ulong)local_4c);
      Abc_Print(-2,"\t-O num : the number of outputs [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-P num : the number of products [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-S num : ramdom seed (0 <= num <= 1000) [default = %d]\n",(ulong)uVar4);
      pcVar8 = "yes";
      pcVar6 = "yes";
      if (!bVar9) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle generating sorter as a PLA file [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle generating prime detector [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandGen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Pla_GenSorter( int nVars );
    Pla_Man_t * p  = NULL;
    int nInputs      =  8;
    int nOutputs     =  1;
    int nCubes       = 20;
    int Seed         =  0;
    int fSorter      =  0;
    int fPrimes      =  0;
    int c, fVerbose  =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOPSspvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInputs < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutputs < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubes < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            Seed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Seed < 0 )
                goto usage;
            break;
        case 's':
            fSorter ^= 1;
            break;
        case 'p':
            fPrimes ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fSorter )
        Pla_GenSorter( nInputs );
    else if ( fPrimes )
        p = Pla_ManPrimesDetector( nInputs );
    else
    {
        Gia_ManRandom( 1 );
        for ( c = 0; c < Seed; c++ )
            Gia_ManRandom( 0 );
        p = Pla_ManGenerate( nInputs, nOutputs, nCubes, fVerbose );
    }
    Pla_AbcUpdateMan( pAbc, p );
    return 0;
usage:
    Abc_Print( -2, "usage: |gen [-IOPS num] [-spvh]\n" );
    Abc_Print( -2, "\t         generate random or specialized SOP\n" );
    Abc_Print( -2, "\t-I num : the number of inputs [default = %d]\n", nInputs );
    Abc_Print( -2, "\t-O num : the number of outputs [default = %d]\n", nOutputs );
    Abc_Print( -2, "\t-P num : the number of products [default = %d]\n", nCubes );
    Abc_Print( -2, "\t-S num : ramdom seed (0 <= num <= 1000) [default = %d]\n", Seed );
    Abc_Print( -2, "\t-s     : toggle generating sorter as a PLA file [default = %s]\n", fSorter? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle generating prime detector [default = %s]\n", fPrimes? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}